

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fInternalFormatQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::InternalFormatQueryTests::init
          (InternalFormatQueryTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  char *pcVar1;
  int extraout_EAX;
  TestNode *node;
  char *description;
  TestCase *pTVar2;
  long lVar3;
  allocator<char> local_b5;
  deUint32 local_b4;
  long local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  string desc;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar3 = 0;
  while( true ) {
    node = (TestNode *)operator_new(0x70);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar3 == 3) break;
    pcVar1 = init::textureTargets[lVar3].name;
    local_b4 = init::textureTargets[lVar3].target;
    local_b0 = lVar3;
    description = glu::getInternalFormatTargetName(local_b4);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,testCtx,pcVar1,description);
    tcu::TestNode::addChild((TestNode *)this,node);
    for (lVar3 = 8; lVar3 != 0x298; lVar3 = lVar3 + 0x10) {
      pcVar1 = *(char **)(&UNK_01e59148 + lVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&desc,pcVar1,(allocator<char> *)&local_50);
      std::operator+(&name,&desc,"_samples");
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Verify GL_SAMPLES of ",&local_b5);
      std::operator+(&desc,&local_50,pcVar1);
      std::__cxx11::string::~string((string *)&local_50);
      pTVar2 = (TestCase *)operator_new(0x88);
      local_a8 = *(undefined8 *)((long)&init::internalFormats[0].name + lVar3);
      uStack_a0 = 0;
      gles31::TestCase::TestCase
                (pTVar2,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 desc._M_dataplus._M_p);
      (pTVar2->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e59438
      ;
      *(deUint32 *)&pTVar2[1].super_TestCase.super_TestNode._vptr_TestNode = local_b4;
      *(undefined8 *)((long)&pTVar2[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = local_a8;
      tcu::TestNode::addChild(node,(TestNode *)pTVar2);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&name);
    }
    lVar3 = local_b0 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,testCtx,"partial_query","Query data to too short a buffer");
  tcu::TestNode::addChild((TestNode *)this,node);
  pTVar2 = (TestCase *)operator_new(0x78);
  gles31::TestCase::TestCase
            (pTVar2,(this->super_TestCaseGroup).m_context,"num_sample_counts",
             "Query GL_NUM_SAMPLE_COUNTS to too short a buffer");
  (pTVar2->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e59488;
  tcu::TestNode::addChild(node,(TestNode *)pTVar2);
  pTVar2 = (TestCase *)operator_new(0x78);
  gles31::TestCase::TestCase
            (pTVar2,(this->super_TestCaseGroup).m_context,"samples",
             "Query GL_SAMPLES to too short a buffer");
  (pTVar2->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e594d8;
  tcu::TestNode::addChild(node,(TestNode *)pTVar2);
  return extraout_EAX;
}

Assistant:

void InternalFormatQueryTests::init (void)
{
	static const struct InternalFormat
	{
		const char*						name;
		glw::GLenum						format;
		FormatSamplesCase::FormatType	type;
	} internalFormats[] =
	{
		// color renderable
		{ "r8",						GL_R8,					FormatSamplesCase::FORMAT_COLOR			},
		{ "rg8",					GL_RG8,					FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb8",					GL_RGB8,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb565",					GL_RGB565,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgba4",					GL_RGBA4,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb5_a1",				GL_RGB5_A1,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgba8",					GL_RGBA8,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb10_a2",				GL_RGB10_A2,			FormatSamplesCase::FORMAT_COLOR			},
		{ "rgb10_a2ui",				GL_RGB10_A2UI,			FormatSamplesCase::FORMAT_INT			},
		{ "srgb8_alpha8",			GL_SRGB8_ALPHA8,		FormatSamplesCase::FORMAT_COLOR			},
		{ "r8i",					GL_R8I,					FormatSamplesCase::FORMAT_INT			},
		{ "r8ui",					GL_R8UI,				FormatSamplesCase::FORMAT_INT			},
		{ "r16i",					GL_R16I,				FormatSamplesCase::FORMAT_INT			},
		{ "r16ui",					GL_R16UI,				FormatSamplesCase::FORMAT_INT			},
		{ "r32i",					GL_R32I,				FormatSamplesCase::FORMAT_INT			},
		{ "r32ui",					GL_R32UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rg8i",					GL_RG8I,				FormatSamplesCase::FORMAT_INT			},
		{ "rg8ui",					GL_RG8UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rg16i",					GL_RG16I,				FormatSamplesCase::FORMAT_INT			},
		{ "rg16ui",					GL_RG16UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rg32i",					GL_RG32I,				FormatSamplesCase::FORMAT_INT			},
		{ "rg32ui",					GL_RG32UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba8i",					GL_RGBA8I,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba8ui",				GL_RGBA8UI,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba16i",				GL_RGBA16I,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba16ui",				GL_RGBA16UI,			FormatSamplesCase::FORMAT_INT			},
		{ "rgba32i",				GL_RGBA32I,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba32ui",				GL_RGBA32UI,			FormatSamplesCase::FORMAT_INT			},

		// float formats
		{ "r16f",					GL_R16F,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rg16f",					GL_RG16F,				FormatSamplesCase::FORMAT_COLOR			},
		{ "rgba16f",				GL_RGBA16F,				FormatSamplesCase::FORMAT_COLOR			},
		{ "r32f",					GL_R32F,				FormatSamplesCase::FORMAT_INT			},
		{ "rg32f",					GL_RG32F,				FormatSamplesCase::FORMAT_INT			},
		{ "rgba32f",				GL_RGBA32F,				FormatSamplesCase::FORMAT_INT			},
		{ "r11f_g11f_b10f",			GL_R11F_G11F_B10F,		FormatSamplesCase::FORMAT_COLOR			},

		// depth renderable
		{ "depth_component16",		GL_DEPTH_COMPONENT16,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth_component24",		GL_DEPTH_COMPONENT24,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth_component32f",		GL_DEPTH_COMPONENT32F,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth24_stencil8",		GL_DEPTH24_STENCIL8,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},
		{ "depth32f_stencil8",		GL_DEPTH32F_STENCIL8,	FormatSamplesCase::FORMAT_DEPTH_STENCIL	},

		// stencil renderable
		{ "stencil_index8",			GL_STENCIL_INDEX8,		FormatSamplesCase::FORMAT_DEPTH_STENCIL	}
		// DEPTH24_STENCIL8,  duplicate
		// DEPTH32F_STENCIL8  duplicate
	};

	static const struct
	{
		const char*	name;
		deUint32	target;
	} textureTargets[] =
	{
		{ "renderbuffer",					GL_RENDERBUFFER					},
		{ "texture_2d_multisample",			GL_TEXTURE_2D_MULTISAMPLE		},
		{ "texture_2d_multisample_array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY	},
	};

	for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(textureTargets); ++groupNdx)
	{
		tcu::TestCaseGroup* const	group		= new tcu::TestCaseGroup(m_testCtx, textureTargets[groupNdx].name, glu::getInternalFormatTargetName(textureTargets[groupNdx].target));
		const glw::GLenum			texTarget	= textureTargets[groupNdx].target;

		addChild(group);

		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(internalFormats); ++caseNdx)
		{
			const std::string name = std::string(internalFormats[caseNdx].name) + "_samples";
			const std::string desc = std::string("Verify GL_SAMPLES of ") + internalFormats[caseNdx].name;

			group->addChild(new FormatSamplesCase(m_context, name.c_str(), desc.c_str(), texTarget, internalFormats[caseNdx].format, internalFormats[caseNdx].type));
		}
	}

	// Check buffer sizes are honored
	{
		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "partial_query", "Query data to too short a buffer");

		addChild(group);

		group->addChild(new NumSampleCountsBufferCase	(m_context, "num_sample_counts",	"Query GL_NUM_SAMPLE_COUNTS to too short a buffer"));
		group->addChild(new SamplesBufferCase			(m_context, "samples",				"Query GL_SAMPLES to too short a buffer"));
	}
}